

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseInputMedia_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  element_type *peVar2;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    switch(peVar2->type) {
    case PHOTO:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"type",&local_59);
      appendToJson<char[6]>(this,__return_storage_ptr__,&local_58,(char (*) [6])0x479c1f);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      break;
    case VIDEO:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"type",&local_81);
      appendToJson<char[6]>(this,__return_storage_ptr__,&local_80,(char (*) [6])0x479c3b);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      break;
    case ANIMATION:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"type",&local_a9);
      appendToJson<char[10]>(this,__return_storage_ptr__,&local_a8,(char (*) [10])"animation");
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      break;
    case DOCUMENT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"type",&local_d1);
      appendToJson<char[9]>(this,__return_storage_ptr__,&local_d0,(char (*) [9])0x479bf4);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      break;
    case AUDIO:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,"type",&local_f9);
      appendToJson<char[6]>(this,__return_storage_ptr__,&local_f8,(char (*) [6])0x479be7);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"media",&local_121);
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_120,&peVar2->media);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"caption",&local_149);
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_148,&peVar2->caption);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"parse_mode",&local_171);
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_170,&peVar2->parseMode);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    if (peVar2->width != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"width",&local_199);
      peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_20);
      appendToJson<int>(this,__return_storage_ptr__,&local_198,&peVar2->width);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
    }
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    if (peVar2->height != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,"height",&local_1c1);
      peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_20);
      appendToJson<int>(this,__return_storage_ptr__,&local_1c0,&peVar2->height);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    }
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    if (peVar2->duration != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1e8,"duration",&local_1e9);
      peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_20);
      appendToJson<int>(this,__return_storage_ptr__,&local_1e8,&peVar2->duration);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    if (peVar2->performer != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"performer",&local_211);
      peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_20);
      appendToJson<int>(this,__return_storage_ptr__,&local_210,&peVar2->performer);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
    peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    if ((peVar2->supportsStreaming & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_238,"supports_streaming",&local_239);
      peVar2 = std::__shared_ptr_access<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_20);
      appendToJson(this,__return_storage_ptr__,&local_238,&peVar2->supportsStreaming);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
    }
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseInputMedia(const InputMedia::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    switch(object->type) {
        case InputMedia::TYPE::PHOTO:
            appendToJson(result, "type", "photo");
        break;
        case InputMedia::TYPE::VIDEO:
            appendToJson(result, "type", "video");
        break;
        case InputMedia::TYPE::ANIMATION:
            appendToJson(result, "type", "animation");
        break;
        case InputMedia::TYPE::DOCUMENT:
            appendToJson(result, "type", "document");
        break;
        case InputMedia::TYPE::AUDIO:
            appendToJson(result, "type", "audio");
        break;
    }   
    appendToJson(result, "media", object->media);
    appendToJson(result, "caption", object->caption);
    appendToJson(result, "parse_mode", object->parseMode);
    if (object->width) {
        appendToJson(result, "width", object->width);
    }
    if (object->height) {
        appendToJson(result, "height", object->height);
    }
    if (object->duration) {
        appendToJson(result, "duration", object->duration);
    }
    if (object->performer) {
        appendToJson(result, "performer", object->performer);
    }
    if (object->supportsStreaming) {
        appendToJson(result, "supports_streaming", object->supportsStreaming);
    }
    removeLastComma(result);
    result += '}';
    return result;
}